

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

char * id2name(name_map *map,int max,uint id)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)max;
  if (max < 1) {
    uVar3 = 0;
  }
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (uVar3 * 0x10 + 0x10 == lVar2 + 0x10) {
      return (char *)0x0;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(uint *)((long)&map->id + lVar2) != id);
  return *(char **)((long)&map->name + lVar2);
}

Assistant:

const char *id2name(const name_map* map, int max, const unsigned int id)
{
	int i;

	for (i = 0; i < max; i++) {
		if (map[i].id == id) {
			return map[i].name;
		}
	}

	// nothing match
	return NULL;
}